

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

int __thiscall QTemporaryFileEngine::open(QTemporaryFileEngine *this,char *__file,int __oflag,...)

{
  byte *pbVar1;
  mode_t mVar2;
  QAbstractFileEnginePrivate *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  qsizetype qVar7;
  char *pcVar8;
  uint *puVar9;
  FileError FVar10;
  long in_FS_OFFSET;
  uint local_a8;
  QSystemError local_a0;
  QTemporaryFileName local_98;
  QFileSystemEntry local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar10 = (FileError)__file | FatalError;
  if (this->filePathIsTemplate == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar5 = QFSFileEngine::open(&this->super_QFSFileEngine,(char *)(ulong)FVar10,__oflag);
      return iVar5;
    }
    goto LAB_0023d908;
  }
  pQVar3 = (this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d;
  local_98.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QTemporaryFileName::QTemporaryFileName(&local_98,this->templateName);
  local_a0.errorCode = 0;
  local_a0.errorScope = NoError;
  mVar2 = this->fileMode;
  bVar4 = qt_haveLinuxProcfs();
  pcVar8 = (char *)(ulong)bVar4;
  if (bVar4) {
    qVar7 = QByteArray::lastIndexOf(&local_98.path,'/',-1);
    if (qVar7 < 0) {
      pcVar8 = ".";
    }
    else {
      pcVar8 = QByteArray::data(&local_98.path);
      qVar7 = qVar7 + (ulong)(qVar7 == 0);
      pcVar8[qVar7] = '\0';
      pcVar8 = QByteArray::data(&local_98.path);
    }
    iVar5 = qt_safe_open(pcVar8,0x410002,mVar2);
    *(int *)&pQVar3[3].q_ptr = iVar5;
    if (iVar5 == -1) {
      puVar9 = (uint *)__errno_location();
      pcVar8 = (char *)(ulong)*puVar9;
      if ((pcVar8 == (char *)0x5f) || (*puVar9 == 0x15)) {
        if (qVar7 != -1) {
          pcVar8 = QByteArray::data(&local_98.path);
          pcVar8[qVar7] = '/';
        }
        goto LAB_0023d754;
      }
      local_a0 = (QSystemError)((ulong)pcVar8 | 0x200000000);
      goto LAB_0023d851;
    }
    this->unnamedFile = true;
    QFileSystemEntry::clear((QFileSystemEntry *)(pQVar3 + 1));
LAB_0023d82a:
    pQVar3[2].fileError = FVar10;
    *(undefined2 *)&pQVar3[4]._vptr_QAbstractFileEnginePrivate = 0x100;
    pbVar1 = (byte *)((long)&pQVar3[4]._vptr_QAbstractFileEnginePrivate + 2);
    *pbVar1 = *pbVar1 & 0xfb;
    iVar5 = (int)CONCAT71((uint7)(uint3)((ulong)__file >> 8),1);
  }
  else {
LAB_0023d754:
    mVar2 = this->fileMode;
    iVar5 = 0x11;
    local_a8 = (uint)pcVar8;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) goto LAB_0023d851;
      QTemporaryFileName::generateNext((NativePath *)&local_70,&local_98);
      pcVar8 = (char *)local_70.m_filePath.d.ptr;
      if (local_70.m_filePath.d.ptr == (char16_t *)0x0) {
        pcVar8 = &QByteArray::_empty;
      }
      iVar6 = qt_safe_open(pcVar8,0xc2,mVar2);
      *(int *)&pQVar3[3].q_ptr = iVar6;
      if (iVar6 == -1) {
        puVar9 = (uint *)__errno_location();
        bVar4 = true;
        if ((ulong)*puVar9 != 0x11) {
          local_a0 = (QSystemError)((ulong)*puVar9 | 0x200000000);
          bVar4 = false;
          local_a8 = 0;
        }
      }
      else {
        local_a8 = 1;
        bVar4 = false;
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
    } while (bVar4);
    if ((local_a8 & 1) != 0) {
      this->filePathIsTemplate = false;
      this->unnamedFile = false;
      QFileSystemEntry::QFileSystemEntry(&local_70,&local_98);
      QFileSystemEntry::operator=((QFileSystemEntry *)(pQVar3 + 1),&local_70);
      QFileSystemEntry::~QFileSystemEntry(&local_70);
      goto LAB_0023d82a;
    }
LAB_0023d851:
    QSystemError::toString(&local_70.m_filePath,&local_a0);
    QAbstractFileEngine::setError((QAbstractFileEngine *)this,OpenError,&local_70.m_filePath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    iVar5 = 0;
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
LAB_0023d908:
  __stack_chk_fail();
}

Assistant:

bool QTemporaryFileEngine::open(QIODevice::OpenMode openMode,
                                std::optional<QFile::Permissions> permissions)
{
    Q_D(QFSFileEngine);
    Q_ASSERT(!isReallyOpen());

    openMode |= QIODevice::ReadWrite;

    if (!filePathIsTemplate)
        return QFSFileEngine::open(openMode, permissions);

    QTemporaryFileName tfn(templateName);

    QSystemError error;
#if defined(Q_OS_WIN)
    NativeFileHandle &file = d->fileHandle;
#else // POSIX
    NativeFileHandle &file = d->fd;
#endif

    CreateUnnamedFileStatus st = createUnnamedFile(file, tfn, fileMode, &error);
    if (st == CreateUnnamedFileStatus::Success) {
        unnamedFile = true;
        d->fileEntry.clear();
    } else if (st == CreateUnnamedFileStatus::NotSupported &&
               createFileFromTemplate(file, tfn, fileMode, flags, error)) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d->fileEntry = QFileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
    } else {
        setError(QFile::OpenError, error.toString());
        return false;
    }

#if !defined(Q_OS_WIN)
    d->closeFileHandle = true;
#endif

    d->openMode = openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;

    return true;
}